

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::ResolvesFeaturesForImpl(DescriptorPool *this,int extension_number)

{
  void *pvVar1;
  pointer ppFVar2;
  FeatureSetDefaults *pFVar3;
  Rep *pRVar4;
  pointer ppFVar5;
  undefined1 *puVar6;
  long lVar7;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar8;
  pointer ppFVar9;
  bool bVar10;
  Metadata MVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FeatureSet features;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  void **local_88;
  FeatureSet local_80;
  
  pFVar3 = GetFeatureSetDefaults(this);
  this_00 = &(pFVar3->field_0)._impl_.defaults_;
  pRVar8 = this_00;
  if ((undefined1  [40])((undefined1  [40])pFVar3->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar8 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
             pRVar4->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
              pRVar4->elements;
  }
  local_88 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
             *(int *)((long)&pFVar3->field_0 + 0x10);
  bVar10 = pRVar8 == (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                      *)local_88;
  if (!bVar10) {
    do {
      pvVar1 = (pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar6 = *(undefined1 **)((long)pvVar1 + 0x20);
      if ((FeatureSet *)puVar6 == (FeatureSet *)0x0) {
        puVar6 = _FeatureSet_default_instance_;
      }
      FeatureSet::FeatureSet(&local_80,(Arena *)0x0,(FeatureSet *)puVar6);
      puVar6 = *(undefined1 **)((long)pvVar1 + 0x18);
      if ((MessageLite *)puVar6 == (MessageLite *)0x0) {
        puVar6 = _FeatureSet_default_instance_;
      }
      FeatureSet::MergeImpl((MessageLite *)&local_80,(MessageLite *)puVar6);
      MVar11 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
      Reflection::ListFields(MVar11.reflection,&local_80.super_Message,&local_a8);
      ppFVar2 = local_a8.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = (long)local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      ppFVar5 = local_a8.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar7) {
        ppFVar5 = (pointer)(((long)local_a8.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U)
                           + (long)local_a8.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        lVar7 = lVar7 + 1;
        ppFVar9 = local_a8.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          if (ppFVar9[-2]->number_ == extension_number) {
            ppFVar9 = ppFVar9 + -2;
            goto LAB_001c52ba;
          }
          if (ppFVar9[-1]->number_ == extension_number) {
            ppFVar9 = ppFVar9 + -1;
            goto LAB_001c52ba;
          }
          if ((*ppFVar9)->number_ == extension_number) goto LAB_001c52ba;
          if (ppFVar9[1]->number_ == extension_number) {
            ppFVar9 = ppFVar9 + 1;
            goto LAB_001c52ba;
          }
          lVar7 = lVar7 + -1;
          ppFVar9 = ppFVar9 + 4;
        } while (1 < lVar7);
      }
      lVar7 = (long)local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3;
      if (lVar7 == 1) {
LAB_001c529b:
        ppFVar9 = ppFVar5;
        if ((*ppFVar5)->number_ != extension_number) {
          ppFVar9 = local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (lVar7 == 2) {
LAB_001c528f:
        ppFVar9 = ppFVar5;
        if ((*ppFVar5)->number_ != extension_number) {
          ppFVar5 = ppFVar5 + 1;
          goto LAB_001c529b;
        }
      }
      else {
        ppFVar9 = local_a8.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((lVar7 == 3) && (ppFVar9 = ppFVar5, (*ppFVar5)->number_ != extension_number)) {
          ppFVar5 = ppFVar5 + 1;
          goto LAB_001c528f;
        }
      }
LAB_001c52ba:
      FeatureSet::~FeatureSet(&local_80);
      if (local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (ppFVar9 == ppFVar2) {
        return bVar10;
      }
      pRVar8 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
               &(pRVar8->super_RepeatedPtrFieldBase).current_size_;
      bVar10 = pRVar8 == (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                          *)local_88;
    } while (!bVar10);
  }
  return bVar10;
}

Assistant:

bool DescriptorPool::ResolvesFeaturesForImpl(int extension_number) const {
  for (const auto& edition_default : GetFeatureSetDefaults().defaults()) {
    std::vector<const FieldDescriptor*> fields;
    auto features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    features.GetReflection()->ListFields(features, &fields);
    if (absl::c_find_if(fields, [&](const FieldDescriptor* field) {
          return field->number() == extension_number;
        }) == fields.end()) {
      return false;
    }
  }
  return true;
}